

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O1

void __thiscall net_uv::KCPServer::run(KCPServer *this)

{
  UVLoop *this_00;
  int __fd;
  
  Runnable::startIdle((Runnable *)this);
  this_00 = &(this->super_Server).super_Runnable.m_loop;
  __fd = 0;
  UVLoop::run(this_00,UV_RUN_DEFAULT);
  if (this->m_server != (KCPSocket *)0x0) {
    (**(this->m_server->super_Socket)._vptr_Socket)();
    free(this->m_server);
    this->m_server = (KCPSocket *)0x0;
  }
  UVLoop::close(this_00,__fd);
  (this->super_Server).m_serverStage = STOP;
  (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,7,0,0,0);
  return;
}

Assistant:

void KCPServer::run()
{
	startIdle();

	m_loop.run(UV_RUN_DEFAULT);

	if (m_server)
	{
		m_server->~KCPSocket();
		fc_free(m_server);
		m_server = NULL;
	}

	m_loop.close();

	m_serverStage = ServerStage::STOP;
	pushThreadMsg(NetThreadMsgType::EXIT_LOOP, NULL);
}